

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateSizeCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
          *arrayIts,string *structName,bool mutualExclusiveLens)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  undefined8 uVar1;
  string *this_00;
  bool bVar2;
  const_reference cVar3;
  int iVar4;
  size_type sVar5;
  reference p_Var6;
  pointer pMVar7;
  size_type sVar8;
  ulong uVar9;
  const_reference pvVar10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_938;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_7a1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  undefined1 local_718 [64];
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  string throwCheck;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 local_418 [8];
  string assertionCheck;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [8];
  string secondName;
  size_t second;
  string local_360;
  string local_340;
  string local_320;
  undefined1 local_300 [8];
  string firstName;
  size_t first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_208 [64];
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  local_c0;
  __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  it;
  const_iterator __end3;
  const_iterator __begin3;
  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
  *__range3;
  string sum;
  string throwText;
  string assertionText;
  allocator<char> local_2b;
  undefined1 local_2a;
  byte local_29;
  string *psStack_28;
  bool mutualExclusiveLens_local;
  string *structName_local;
  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
  *arrayIts_local;
  VulkanHppGenerator *this_local;
  string *sizeCheck;
  
  local_2a = 0;
  local_29 = mutualExclusiveLens;
  psStack_28 = structName;
  structName_local = (string *)arrayIts;
  arrayIts_local =
       (vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
        *)this;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar5 = std::
          vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
          ::size((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  *)structName_local);
  if (1 < sVar5) {
    if ((generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
         ::throwTextTemplate_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                                     ::throwTextTemplate_abi_cxx11_), iVar4 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                  ::throwTextTemplate_abi_cxx11_,
                 "      if ( ${throwCheck} )\n      {\n        throw LogicError( VULKAN_HPP_NAMESPACE_STRING\"::${structName}::${structName}: ${throwCheck}\" );\n      }\n"
                 ,&local_2b);
      std::allocator<char>::~allocator(&local_2b);
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                    ::throwTextTemplate_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                           ::throwTextTemplate_abi_cxx11_);
    }
    std::__cxx11::string::string((string *)(throwText.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(sum.field_2._M_local_buf + 8));
    if ((local_29 & 1) == 0) {
      for (firstName.field_2._8_8_ = 0; uVar9 = firstName.field_2._8_8_ + 1,
          sVar5 = std::
                  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  ::size((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                          *)structName_local), uVar9 < sVar5;
          firstName.field_2._8_8_ = firstName.field_2._8_8_ + 1) {
        pvVar10 = std::
                  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                *)structName_local,firstName.field_2._8_8_);
        pMVar7 = __gnu_cxx::
                 __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                 ::operator->(pvVar10);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(&pMVar7->name,"p");
        if (!bVar2) {
          __assert_fail("arrayIts[first]->name.starts_with( \"p\" )",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x2abf,
                        "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                       );
        }
        pvVar10 = std::
                  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                *)structName_local,firstName.field_2._8_8_);
        pMVar7 = __gnu_cxx::
                 __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                 ::operator->(pvVar10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"p",(allocator<char> *)((long)&second + 7));
        stripPrefix(&local_340,&pMVar7->name,&local_360);
        anon_unknown.dwarf_b1723::startLowerCase(&local_320,&local_340);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,&local_320,"_");
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)((long)&second + 7));
        secondName.field_2._8_8_ = firstName.field_2._8_8_;
        while( true ) {
          secondName.field_2._8_8_ = secondName.field_2._8_8_ + 1;
          uVar1 = secondName.field_2._8_8_;
          sVar5 = std::
                  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  ::size((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                          *)structName_local);
          if (sVar5 <= (ulong)uVar1) break;
          pvVar10 = std::
                    vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                    ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                  *)structName_local,secondName.field_2._8_8_);
          pMVar7 = __gnu_cxx::
                   __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                   ::operator->(pvVar10);
          bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(&pMVar7->name,"p");
          if (!bVar2) {
            __assert_fail("arrayIts[second]->name.starts_with( \"p\" )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2ac3,
                          "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                         );
          }
          pvVar10 = std::
                    vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                    ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                  *)structName_local,secondName.field_2._8_8_);
          pMVar7 = __gnu_cxx::
                   __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                   ::operator->(pvVar10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,"p",
                     (allocator<char> *)(assertionCheck.field_2._M_local_buf + 0xf));
          stripPrefix(&local_3d0,&pMVar7->name,&local_3f0);
          anon_unknown.dwarf_b1723::startLowerCase(&local_3b0,&local_3d0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390,&local_3b0,"_");
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(assertionCheck.field_2._M_local_buf + 0xf));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&throwCheck.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300,".size() == ");
          std::operator+(&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&throwCheck.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_418,&local_438,".size()");
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)(throwCheck.field_2._M_local_buf + 8));
          std::operator+(&local_4b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_300,".size() != ");
          std::operator+(&local_498,&local_4b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_478,&local_498,".size()");
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          pvVar10 = std::
                    vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                    ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                  *)structName_local,firstName.field_2._8_8_);
          pMVar7 = __gnu_cxx::
                   __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                   ::operator->(pvVar10);
          bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(&pMVar7->optional);
          if (bVar2) {
LAB_001a60ad:
            pvVar10 = std::
                      vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                      ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                    *)structName_local,secondName.field_2._8_8_);
            pMVar7 = __gnu_cxx::
                     __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                     ::operator->(pvVar10);
            bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(&pMVar7->optional);
            if (!bVar2) {
              pvVar10 = std::
                        vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                      *)structName_local,secondName.field_2._8_8_);
              pMVar7 = __gnu_cxx::
                       __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                       ::operator->(pvVar10);
              cVar3 = std::vector<bool,_std::allocator<bool>_>::front(&pMVar7->optional);
              if (cVar3) goto LAB_001a611a;
            }
          }
          else {
            pvVar10 = std::
                      vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                      ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                    *)structName_local,firstName.field_2._8_8_);
            pMVar7 = __gnu_cxx::
                     __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                     ::operator->(pvVar10);
            cVar3 = std::vector<bool,_std::allocator<bool>_>::front(&pMVar7->optional);
            if (!cVar3) goto LAB_001a60ad;
LAB_001a611a:
            std::operator+(&local_4f8,"( ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_418);
            std::operator+(&local_4d8,&local_4f8," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418
                      ,&local_4d8);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::operator+(&local_538,"( ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_478);
            std::operator+(&local_518,&local_538," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478
                      ,&local_518);
            std::__cxx11::string::~string((string *)&local_518);
            std::__cxx11::string::~string((string *)&local_538);
            pvVar10 = std::
                      vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                      ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                    *)structName_local,secondName.field_2._8_8_);
            pMVar7 = __gnu_cxx::
                     __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                     ::operator->(pvVar10);
            bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(&pMVar7->optional);
            if (!bVar2) {
              pvVar10 = std::
                        vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                      *)structName_local,secondName.field_2._8_8_);
              pMVar7 = __gnu_cxx::
                       __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                       ::operator->(pvVar10);
              cVar3 = std::vector<bool,_std::allocator<bool>_>::front(&pMVar7->optional);
              if (cVar3) {
                std::operator+(&local_578,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_390,".empty() || ");
                std::operator+(&local_558,&local_578,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_418);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_418,&local_558);
                std::__cxx11::string::~string((string *)&local_558);
                std::__cxx11::string::~string((string *)&local_578);
                std::operator+(&local_5d8,"!",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_390);
                std::operator+(&local_5b8,&local_5d8,".empty() && ");
                std::operator+(&local_598,&local_5b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_478);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_478,&local_598);
                std::__cxx11::string::~string((string *)&local_598);
                std::__cxx11::string::~string((string *)&local_5b8);
                std::__cxx11::string::~string((string *)&local_5d8);
              }
            }
            pvVar10 = std::
                      vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                      ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                    *)structName_local,firstName.field_2._8_8_);
            pMVar7 = __gnu_cxx::
                     __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                     ::operator->(pvVar10);
            bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(&pMVar7->optional);
            if (!bVar2) {
              pvVar10 = std::
                        vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        ::operator[]((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                      *)structName_local,firstName.field_2._8_8_);
              pMVar7 = __gnu_cxx::
                       __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                       ::operator->(pvVar10);
              cVar3 = std::vector<bool,_std::allocator<bool>_>::front(&pMVar7->optional);
              if (cVar3) {
                std::operator+(&local_618,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_300,".empty() || ");
                std::operator+(&local_5f8,&local_618,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_418);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_418,&local_5f8);
                std::__cxx11::string::~string((string *)&local_5f8);
                std::__cxx11::string::~string((string *)&local_618);
                std::operator+(&local_678,"!",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_300);
                std::operator+(&local_658,&local_678,".empty() && ");
                std::operator+(&local_638,&local_658,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_478);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_478,&local_638);
                std::__cxx11::string::~string((string *)&local_638);
                std::__cxx11::string::~string((string *)&local_658);
                std::__cxx11::string::~string((string *)&local_678);
              }
            }
          }
          std::operator+(&local_6b8,"      VULKAN_HPP_ASSERT( ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_418);
          std::operator+(&local_698,&local_6b8," );\n");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&throwText.field_2 + 8),&local_698);
          std::__cxx11::string::~string((string *)&local_698);
          std::__cxx11::string::~string((string *)&local_6b8);
          local_7a0 = &local_798;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[11],_true>(local_7a0,(char (*) [11])"structName",psStack_28);
          local_7a0 = &local_758;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (local_7a0,(char (*) [11])"throwCheck",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478)
          ;
          local_718._0_8_ = &local_798;
          local_718._8_8_ = 2;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_7a2);
          __l._M_len = local_718._8_8_;
          __l._M_array = (iterator)local_718._0_8_;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_718 + 0x10),__l,&local_7a1,&local_7a2);
          replaceWithMap(&local_6d8,
                         &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                          ::throwTextTemplate_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_718 + 0x10));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&sum.field_2 + 8),&local_6d8);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_718 + 0x10));
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~allocator(&local_7a2);
          local_938 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_718;
          do {
            local_938 = local_938 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(local_938);
          } while (local_938 != &local_798);
          std::__cxx11::string::~string((string *)local_478);
          std::__cxx11::string::~string((string *)local_418);
          std::__cxx11::string::~string((string *)local_390);
        }
        std::__cxx11::string::~string((string *)local_300);
      }
    }
    else {
      std::__cxx11::string::string((string *)&__range3);
      this_00 = structName_local;
      __end3 = std::
               vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               ::begin((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        *)structName_local);
      it._M_current =
           (MemberData *)
           std::
           vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
           ::end((vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                  *)this_00);
      while (bVar2 = __gnu_cxx::
                     operator==<const___gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>_>
                               (&__end3,(__normal_iterator<const___gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>_>
                                         *)&it), ((bVar2 ^ 0xffU) & 1) != 0) {
        p_Var6 = __gnu_cxx::
                 __normal_iterator<const___gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>_>
                 ::operator*(&__end3);
        local_c0._M_current = p_Var6->_M_current;
        pMVar7 = __gnu_cxx::
                 __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                 ::operator->(&local_c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"p",&local_161);
        stripPrefix(&local_140,&pMVar7->name,&local_160);
        anon_unknown.dwarf_b1723::startLowerCase(&local_120,&local_140);
        std::operator+(&local_100,"!",&local_120);
        std::operator+(&local_e0,&local_100,"_.empty() + ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                   &local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
        __gnu_cxx::
        __normal_iterator<const___gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>_>
        ::operator++(&__end3);
      }
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                 sVar8 - 3);
      std::operator+(&local_1a8,"      VULKAN_HPP_ASSERT( ( ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3)
      ;
      std::operator+(&local_188,&local_1a8," ) <= 1);\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&throwText.field_2 + 8),&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      first._7_1_ = 1;
      local_290 = &local_288;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(local_290,(char (*) [11])"structName",psStack_28);
      local_290 = &local_248;
      std::operator+(&local_2d0,"1 < ( ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3)
      ;
      std::operator+(&local_2b0,&local_2d0," )");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_248,(char (*) [11])"throwCheck",&local_2b0);
      first._7_1_ = 0;
      local_208._0_8_ = &local_288;
      local_208._8_8_ = 2;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&first + 5));
      __l_00._M_len = local_208._8_8_;
      __l_00._M_array = (iterator)local_208._0_8_;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_208 + 0x10),__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&first + 6),
            (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&first + 5));
      replaceWithMap(&local_1c8,
                     &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                      ::throwTextTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_208 + 0x10));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sum.field_2 + 8),&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_208 + 0x10));
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&first + 5));
      local_890 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_208;
      do {
        local_890 = local_890 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_890);
      } while (local_890 != &local_288);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&__range3);
    }
    std::operator+(&local_848,"\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&throwText.field_2 + 8));
    std::operator+(&local_828,&local_848,"#else\n");
    std::operator+(&local_808,&local_828,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&sum.field_2 + 8));
    std::operator+(&local_7e8,&local_808,"#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n");
    std::operator+(&local_7c8,&local_7e8,"    ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_7c8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)(sum.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(throwText.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSizeCheck( std::vector<std::vector<MemberData>::const_iterator> const & arrayIts,
                                                   std::string const &                                          structName,
                                                   bool                                                         mutualExclusiveLens ) const
{
  std::string sizeCheck;
  if ( 1 < arrayIts.size() )
  {
    static const std::string throwTextTemplate = R"(      if ( ${throwCheck} )
      {
        throw LogicError( VULKAN_HPP_NAMESPACE_STRING"::${structName}::${structName}: ${throwCheck}" );
      }
)";

    std::string assertionText, throwText;
    if ( mutualExclusiveLens )
    {
      // exactly one of the arrays has to be non-empty
      std::string sum;
      for ( auto it : arrayIts )
      {
        sum += "!" + startLowerCase( stripPrefix( it->name, "p" ) ) + "_.empty() + ";
      }
      sum.resize( sum.size() - 3 );
      assertionText += "      VULKAN_HPP_ASSERT( ( " + sum + " ) <= 1);\n";
      throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", "1 < ( " + sum + " )" } } );
    }
    else
    {
      for ( size_t first = 0; first + 1 < arrayIts.size(); ++first )
      {
        assert( arrayIts[first]->name.starts_with( "p" ) );
        std::string firstName = startLowerCase( stripPrefix( arrayIts[first]->name, "p" ) ) + "_";
        for ( auto second = first + 1; second < arrayIts.size(); ++second )
        {
          assert( arrayIts[second]->name.starts_with( "p" ) );
          std::string secondName     = startLowerCase( stripPrefix( arrayIts[second]->name, "p" ) ) + "_";
          std::string assertionCheck = firstName + ".size() == " + secondName + ".size()";
          std::string throwCheck     = firstName + ".size() != " + secondName + ".size()";
          if ( ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() ) ||
               ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() ) )
          {
            assertionCheck = "( " + assertionCheck + " )";
            throwCheck     = "( " + throwCheck + " )";
            if ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() )
            {
              assertionCheck = secondName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + secondName + ".empty() && " + throwCheck;
            }
            if ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() )
            {
              assertionCheck = firstName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + firstName + ".empty() && " + throwCheck;
            }
          }
          assertionText += "      VULKAN_HPP_ASSERT( " + assertionCheck + " );\n";
          throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", throwCheck } } );
        }
      }
    }
    sizeCheck += "\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n" + assertionText + "#else\n" + throwText + "#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n" + "    ";
  }
  return sizeCheck;
}